

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_map.c
# Opt level: O0

int map_bucket_realloc_iterator(map m,map_key key,map_value value,map_cb_iterate_args args)

{
  int iVar1;
  bucket b_00;
  long *in_RCX;
  long in_RSI;
  long *in_RDI;
  bucket b;
  size_t index;
  map_hash h;
  map new_map;
  int local_4;
  
  if (((in_RCX == in_RDI) || (in_RSI == 0)) || (in_RCX == (long *)0x0)) {
    local_4 = 1;
  }
  else {
    b_00 = (bucket)(*(code *)in_RCX[4])(in_RSI);
    iVar1 = bucket_insert(b_00,(void *)((ulong)b_00 % (ulong)in_RCX[1]),
                          (void *)(in_RCX[3] + (long)((ulong)b_00 % (ulong)in_RCX[1]) * 0x18));
    if (iVar1 == 0) {
      *in_RCX = *in_RCX + 1;
      local_4 = 0;
    }
    else {
      log_write_impl_va("metacall",0x79,"map_bucket_realloc_iterator",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_map.c"
                        ,LOG_LEVEL_ERROR,"Invalid map bucket realloc insertion");
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int map_bucket_realloc_iterator(map m, map_key key, map_value value, map_cb_iterate_args args)
{
	map new_map = (map)args;

	if (new_map != m && key != NULL && args != NULL)
	{
		map_hash h = new_map->hash_cb(key);

		size_t index = h % new_map->capacity;

		bucket b = &new_map->buckets[index];

		if (bucket_insert(b, key, value) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid map bucket realloc insertion");
			return 1;
		}

		++new_map->count;

		return 0;
	}

	return 1;
}